

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall merc::KeywordNode::~KeywordNode(KeywordNode *this)

{
  ASTNode::~ASTNode(&this->super_ASTNode);
  operator_delete(this,0x40);
  return;
}

Assistant:

~KeywordNode() = default;